

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

void __thiscall absl::lts_20250127::Mutex::ReaderUnlock(Mutex *this)

{
  bool bVar1;
  long lVar2;
  __int_type_conflict v;
  bool bVar3;
  
  DebugOnlyLockLeave(this);
  v = (this->mu_).super___atomic_base<long>._M_i;
  if (((uint)v & 9) != 1) {
    __assert_fail("(v & (kMuWriter | kMuReader)) == kMuReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/synchronization/mutex.cc"
                  ,0x6f7,"void absl::Mutex::ReaderUnlock()");
  }
  do {
    if (((uint)v & 0x15) != 1) {
      UnlockSlow(this,(SynchWaitParams *)0x0);
      return;
    }
    bVar1 = ExactlyOneReader(v);
    LOCK();
    lVar2 = (this->mu_).super___atomic_base<long>._M_i;
    bVar3 = v == lVar2;
    if (bVar3) {
      (this->mu_).super___atomic_base<long>._M_i = (v - (ulong)bVar1) + -0x100;
      lVar2 = v;
    }
    UNLOCK();
    v = lVar2;
  } while (!bVar3);
  return;
}

Assistant:

void Mutex::ReaderUnlock() {
  ABSL_TSAN_MUTEX_PRE_UNLOCK(this, __tsan_mutex_read_lock);
  DebugOnlyLockLeave(this);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  assert((v & (kMuWriter | kMuReader)) == kMuReader);
  for (;;) {
    if (ABSL_PREDICT_FALSE((v & (kMuReader | kMuWait | kMuEvent)) !=
                           kMuReader)) {
      this->UnlockSlow(nullptr /*no waitp*/);  // take slow path
      break;
    }
    // fast reader release (reader with no waiters)
    intptr_t clear = ExactlyOneReader(v) ? kMuReader | kMuOne : kMuOne;
    if (ABSL_PREDICT_TRUE(
            mu_.compare_exchange_strong(v, v - clear, std::memory_order_release,
                                        std::memory_order_relaxed))) {
      break;
    }
  }
  ABSL_TSAN_MUTEX_POST_UNLOCK(this, __tsan_mutex_read_lock);
}